

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void rtosc::walk_ports(Ports *base,char *name_buffer,size_t buffer_size,void *data,
                      port_walker_t walker,bool expand_bundles,void *runtime,bool ranges)

{
  Ports *pPVar1;
  byte ranges_00;
  bool bVar2;
  size_t sVar3;
  Ports *name_buffer_00;
  Port *port;
  itr_t base_00;
  itr_t iVar4;
  reference pPVar5;
  char *pcVar6;
  byte expand_bundles_00;
  Ports *in_RCX;
  Ports *in_RDX;
  Port *unaff_RBX;
  char *in_RSI;
  Ports *in_RDI;
  Ports *in_R8;
  byte in_R9B;
  _func_void_Port_ptr_char_ptr_char_ptr_Ports_ptr_void_ptr_void_ptr **unaff_R14;
  Ports *in_stack_00000008;
  byte in_stack_00000010;
  undefined7 in_stack_00000011;
  char *in_stack_00000018;
  char *in_stack_00000020;
  char *in_stack_00000030;
  char *tmp;
  Port *p;
  itr_t __end2;
  itr_t __begin2;
  Ports *__range2;
  char *old_end;
  Ports *p_00;
  Ports *__lhs;
  Ports *local_78;
  undefined6 in_stack_ffffffffffffffb8;
  Ports *walker_00;
  Ports *pPVar7;
  Ports *base_01;
  char *loc;
  Ports *name_buffer_01;
  
  expand_bundles_00 = in_R9B & 1;
  ranges_00 = in_stack_00000010 & 1;
  if (in_RDI != (Ports *)0x0) {
    if (*in_RSI == '\0') {
      *in_RSI = '/';
    }
    __lhs = in_RCX;
    base_01 = in_RDX;
    loc = in_RSI;
    sVar3 = strlen(in_RSI);
    name_buffer_00 = (Ports *)(in_RSI + sVar3);
    port = Ports::operator[](in_RDX,(char *)in_RCX);
    walker_00 = in_R8;
    p_00 = __lhs;
    bVar2 = port_is_enabled(port,loc,(size_t)base_01,in_RDI,in_stack_00000008,false,
                            (port_walker_t)in_R8,__lhs);
    if (bVar2) {
      name_buffer_01 = in_RDI;
      base_00 = Ports::begin(in_R8);
      iVar4 = Ports::end(in_R8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                                 *)__lhs,(__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                                          *)in_R8), bVar2) {
        pPVar5 = __gnu_cxx::
                 __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                 ::operator*((__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                              *)&stack0xffffffffffffffa0);
        if (pPVar5->ports == (Ports *)0x0) {
          pcVar6 = strchr(pPVar5->name,0x23);
          if (pcVar6 == (char *)0x0) {
            scat(loc,pPVar5->name);
            local_78 = name_buffer_00;
            (*(code *)walker_00)(pPVar5,loc,name_buffer_00,name_buffer_01,p_00,in_stack_00000008);
            pPVar7 = p_00;
            pPVar1 = local_78;
          }
          else {
            __lhs = in_stack_00000008;
            local_78 = name_buffer_00;
            pPVar7 = p_00;
            bundle_foreach<void(*)(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)>
                      ((Port *)p_00,(char *)walker_00,
                       (char *)CONCAT17(expand_bundles_00,
                                        CONCAT16(ranges_00,in_stack_ffffffffffffffb8)),
                       (char *)name_buffer_00,(size_t)in_RDI,(Ports *)base_00._M_current,
                       name_buffer_01,unaff_RBX,unaff_R14,SUB81((ulong)iVar4._M_current >> 0x38,0),
                       SUB81((ulong)iVar4._M_current >> 0x30,0),
                       SUB81((ulong)iVar4._M_current >> 0x28,0));
            pPVar1 = local_78;
            in_R8 = p_00;
          }
        }
        else {
          in_R8 = in_stack_00000008;
          local_78 = name_buffer_00;
          walk_ports_recurse0(unaff_RBX,(char *)name_buffer_01,(size_t)loc,base_01,p_00,
                              (port_walker_t)walker_00,
                              (void *)CONCAT71(in_stack_00000011,in_stack_00000010),
                              in_stack_00000018,in_stack_00000020,(bool)expand_bundles_00,
                              in_stack_00000030,(bool)ranges_00);
          pPVar7 = p_00;
          pPVar1 = local_78;
          __lhs = name_buffer_00;
        }
        while (name_buffer_00 = pPVar1, p_00 = pPVar7,
              *(char *)&(local_78->ports).
                        super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                        super__Vector_impl_data._M_start != '\0') {
          *(char *)&(local_78->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                    _M_impl.super__Vector_impl_data._M_start = '\0';
          local_78 = (Ports *)((long)&(local_78->ports).
                                      super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 1);
          pPVar7 = p_00;
          pPVar1 = name_buffer_00;
        }
        __gnu_cxx::
        __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
        ::operator++((__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                      *)&stack0xffffffffffffffa0);
      }
    }
  }
  return;
}

Assistant:

void rtosc::walk_ports(const Ports  *base,
                       char         *name_buffer,
                       size_t        buffer_size,
                       void         *data,
                       port_walker_t walker,
                       bool          expand_bundles,
                       void*         runtime,
                       bool          ranges)
{
    //only walk valid ports
    if(!base)
        return;

    assert(name_buffer);
    //XXX buffer_size is not properly handled yet
    if(name_buffer[0] == 0)
        name_buffer[0] = '/';

    char * const old_end = name_buffer + strlen(name_buffer);

    if(port_is_enabled((*base)["self:"], name_buffer, buffer_size, *base,
                       runtime, false, walker, data))
    for(const Port &p: *base) {
        //if(strchr(p.name, '/')) {//it is another tree
        if(p.ports) {//it is another tree

            walk_ports_recurse0(p, name_buffer, buffer_size,
                                base, data, walker, runtime, old_end, old_end,
                                expand_bundles, p.name, ranges);

        } else {
            if(strchr(p.name,'#')) {
                bundle_foreach(p, p.name, old_end, name_buffer, buffer_size, *base,
                               data, runtime, walker, expand_bundles, true, ranges);
            } else {
                //Append the path
                scat(name_buffer, p.name);

                //Apply walker function
                walker(&p, name_buffer, old_end, *base, data, runtime);
            }
        }

        //Remove the rest of the path
        char *tmp = old_end;
        while(*tmp) *tmp++=0;
    }
}